

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  bool bVar1;
  LRUHandle *pLVar2;
  Mutex *__mutex;
  long lVar3;
  Slice local_40;
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x10) {
      return;
    }
    __mutex = &this->shard_[lVar3].mutex_;
    std::mutex::lock(&__mutex->mu_);
    while (pLVar2 = this->shard_[lVar3].lru_.next, pLVar2 != &this->shard_[lVar3].lru_) {
      if (pLVar2->refs != 1) {
        __assert_fail("e->refs == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                      ,0x148,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
      local_40 = LRUHandle::key(pLVar2);
      pLVar2 = HandleTable::Remove(&this->shard_[lVar3].table_,&local_40,pLVar2->hash);
      bVar1 = LRUCache::FinishErase(this->shard_ + lVar3,pLVar2);
      if (!bVar1) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                      ,0x14b,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }